

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O2

int ompt_get_callback(ompt_callbacks_t which,ompt_callback_t *callback)

{
  int iVar1;
  ompt_callback_target_data_op_t p_Var2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  bool bVar6;
  
  iVar1 = 0;
  bVar3 = ompt_enabled._0_1_;
  if (((ulong)ompt_enabled & 1) == 0) {
    return 0;
  }
  uVar5 = ompt_enabled._0_4_;
  bVar4 = ompt_enabled._3_1_;
  switch(which) {
  case ompt_callback_thread_begin:
    bVar4 = bVar3 >> 1;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_thread_begin_callback;
    break;
  case ompt_callback_thread_end:
    bVar4 = bVar3 >> 2;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_thread_end_callback;
    break;
  case ompt_callback_parallel_begin:
    bVar4 = bVar3 >> 3;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_parallel_begin_callback;
    break;
  case ompt_callback_parallel_end:
    bVar4 = bVar3 >> 4;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_parallel_end_callback;
    break;
  case ompt_callback_task_create:
    bVar4 = bVar3 >> 5;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_task_create_callback;
    break;
  case ompt_callback_task_schedule:
    bVar4 = bVar3 >> 6;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_task_schedule_callback;
    break;
  case ompt_callback_implicit_task:
    bVar6 = (char)bVar3 < '\0';
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_implicit_task_callback;
    goto LAB_0016bea6;
  case ompt_callback_target:
    bVar4 = ompt_enabled._1_1_;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_target_callback;
    break;
  case ompt_callback_target_data_op:
    bVar4 = (byte)(uVar5 >> 9);
    p_Var2 = ompt_callbacks.ompt_callback_target_data_op_callback;
    break;
  case ompt_callback_target_submit:
    bVar4 = (byte)(uVar5 >> 10);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_target_submit_callback;
    break;
  case ompt_callback_control_tool:
    bVar4 = (byte)(uVar5 >> 0xb);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_control_tool_callback;
    break;
  case ompt_callback_device_initialize:
    bVar4 = (byte)(uVar5 >> 0xc);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_device_initialize_callback
    ;
    break;
  case ompt_callback_device_finalize:
    bVar4 = (byte)(uVar5 >> 0xd);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_device_finalize_callback;
    break;
  case ompt_callback_device_load:
    bVar4 = (byte)(uVar5 >> 0xe);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_device_load_callback;
    break;
  case ompt_callback_device_unload:
    bVar6 = ompt_enabled._0_2_ < 0;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_device_unload_callback;
    goto LAB_0016bea6;
  case ompt_callback_sync_region_wait:
    bVar4 = ompt_enabled._2_1_;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_sync_region_wait_callback;
    break;
  case ompt_callback_mutex_released:
    bVar4 = (byte)(uVar5 >> 0x11);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_mutex_released_callback;
    break;
  case ompt_callback_dependences:
    bVar4 = (byte)(uVar5 >> 0x12);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_dependences_callback;
    break;
  case ompt_callback_task_dependence:
    bVar4 = (byte)(uVar5 >> 0x13);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_task_dependence_callback;
    break;
  case ompt_callback_work:
    bVar4 = (byte)(uVar5 >> 0x14);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_work_callback;
    break;
  case ompt_callback_master:
    bVar4 = (byte)(uVar5 >> 0x15);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_master_callback;
    break;
  case ompt_callback_target_map:
    bVar4 = (byte)(uVar5 >> 0x16);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_target_map_callback;
    break;
  case ompt_callback_sync_region:
    bVar4 = (byte)(uVar5 >> 0x17);
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_sync_region_callback;
    break;
  case ompt_callback_lock_init:
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_lock_init_callback;
    break;
  case ompt_callback_lock_destroy:
    bVar4 = bVar4 >> 1;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_lock_destroy_callback;
    break;
  case ompt_callback_mutex_acquire:
    bVar4 = bVar4 >> 2;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_mutex_acquire_callback;
    break;
  case ompt_callback_mutex_acquired:
    bVar4 = bVar4 >> 3;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_mutex_acquired_callback;
    break;
  case ompt_callback_nest_lock:
    bVar4 = bVar4 >> 4;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_nest_lock_callback;
    break;
  case ompt_callback_flush:
    bVar4 = bVar4 >> 5;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_flush_callback;
    break;
  case ompt_callback_cancel:
    bVar4 = bVar4 >> 6;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_cancel_callback;
    break;
  case ompt_callback_reduction:
    bVar6 = (int)uVar5 < 0;
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_reduction_callback;
LAB_0016bea6:
    if (!(bool)(bVar6 & p_Var2 != (ompt_callback_target_data_op_t)0x0)) {
      return 0;
    }
    goto LAB_0016bf3a;
  case ompt_callback_dispatch:
    p_Var2 = (ompt_callback_target_data_op_t)ompt_callbacks.ompt_callback_dispatch_callback;
    if ((ompt_callbacks.ompt_callback_dispatch_callback != (ompt_callback_dispatch_t)0x0 &
        ompt_enabled._4_1_) != 1) {
      return 0;
    }
    goto LAB_0016bf3a;
  default:
    goto switchD_0016bc8f_default;
  }
  if ((bVar4 & p_Var2 != (ompt_callback_target_data_op_t)0x0) != 0) {
LAB_0016bf3a:
    *callback = (ompt_callback_t)p_Var2;
    iVar1 = 1;
  }
switchD_0016bc8f_default:
  return iVar1;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_callback(ompt_callbacks_t which,
                                       ompt_callback_t *callback) {
  if (!ompt_enabled.enabled)
    return ompt_get_callback_failure;

  switch (which) {

#define ompt_event_macro(event_name, callback_type, event_id)                  \
  case event_name:                                                             \
    if (ompt_event_implementation_status(event_name)) {                        \
      ompt_callback_t mycb =                                                   \
          (ompt_callback_t)ompt_callbacks.ompt_callback(event_name);           \
      if (ompt_enabled.event_name && mycb) {                                   \
        *callback = mycb;                                                      \
        return ompt_get_callback_success;                                      \
      }                                                                        \
    }                                                                          \
    return ompt_get_callback_failure;

    FOREACH_OMPT_EVENT(ompt_event_macro)

#undef ompt_event_macro

  default:
    return ompt_get_callback_failure;
  }
}